

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-make.c
# Opt level: O2

_Bool pick_and_place_distant_monster(chunk *c,loc to_avoid,wchar_t dis,_Bool sleep,wchar_t depth)

{
  _Bool _Var1;
  uint32_t x;
  uint32_t y;
  wchar_t wVar2;
  loc grid;
  int iVar3;
  
  if (c == (chunk *)0x0) {
    __assert_fail("c",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-make.c"
                  ,0x8e3,
                  "_Bool pick_and_place_distant_monster(struct chunk *, struct loc, int, _Bool, int)"
                 );
  }
  iVar3 = -9999;
  do {
    if (iVar3 == 0) {
      if (((player->opts).opt[0x1a] != false) || ((player->opts).opt[0x16] == true)) {
        msg("Warning! Could not allocate a new monster.");
      }
      return false;
    }
    x = Rand_div(c->width);
    y = Rand_div(c->height);
    grid = (loc)loc(x,y);
    _Var1 = square_isempty((chunk_conflict *)c,grid);
    if (_Var1) {
      if (character_dungeon == false) {
        _Var1 = square_ismon_restrict((chunk_conflict *)c,grid);
        if (_Var1) goto LAB_0017800f;
      }
      wVar2 = distance((loc_conflict)grid,(loc_conflict)to_avoid);
      if (dis < wVar2) {
        _Var1 = pick_and_place_monster(c,grid,depth,sleep,true,'\n');
        return _Var1;
      }
    }
LAB_0017800f:
    iVar3 = iVar3 + 1;
  } while( true );
}

Assistant:

bool pick_and_place_distant_monster(struct chunk *c, struct loc to_avoid,
		int dis, bool sleep, int depth)
{
	struct loc grid;
	int	attempts_left = 10000;

	assert(c);

	/* Find a legal, distant, unoccupied, space */
	while (--attempts_left) {
		/* Pick a location */
		grid = loc(randint0(c->width), randint0(c->height));

		/* Require "naked" floor grid */
		if (!square_isempty(c, grid)) continue;

		/* Do not put random monsters in marked rooms. */
		if ((!character_dungeon) && square_ismon_restrict(c, grid))
			continue;

		/* Accept far away grids */
		if (distance(grid, to_avoid) > dis) break;
	}

	if (!attempts_left) {
		if (OPT(player, cheat_xtra) || OPT(player, cheat_hear))
			msg("Warning! Could not allocate a new monster.");

		return false;
	}

	/* Attempt to place the monster, allow groups */
	if (pick_and_place_monster(c, grid, depth, sleep, true, ORIGIN_DROP))
		return (true);

	/* Nope */
	return (false);
}